

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void __thiscall QSslSocket::disconnectFromHost(QSslSocket *this)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  
  lVar1 = *(long *)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  plVar3 = *(long **)(lVar1 + 0x3f8);
  if ((plVar3 != (long *)0x0) && (iVar2 = *(int *)(lVar1 + 0x260), iVar2 != 0)) {
    if ((*(int *)(lVar1 + 0x270) == 0) && (*(char *)(lVar1 + 0x274) == '\0')) {
LAB_002325de:
      (**(code **)(*plVar3 + 0x100))();
      return;
    }
    if (2 < iVar2) {
      if (*(long **)(lVar1 + 0x408) != (long *)0x0) {
        (**(code **)(**(long **)(lVar1 + 0x408) + 0xb0))();
        iVar2 = *(int *)(lVar1 + 0x260);
      }
      if (iVar2 != 6) {
        *(undefined4 *)(lVar1 + 0x260) = 6;
        QAbstractSocket::stateChanged((QAbstractSocket *)this,ClosingState);
      }
      if ((*(long *)(lVar1 + 0x98) == 0) || (*(long *)(*(long *)(lVar1 + 0x98) + 0x18) == 0)) {
        if (*(int *)(lVar1 + 0x270) != 0) {
          if (*(long **)(lVar1 + 0x408) == (long *)0x0) {
            return;
          }
          (**(code **)(**(long **)(lVar1 + 0x408) + 0xa0))();
          return;
        }
        plVar3 = *(long **)(lVar1 + 0x3f8);
        goto LAB_002325de;
      }
    }
    *(undefined1 *)(lVar1 + 0x193) = 1;
  }
  return;
}

Assistant:

void QSslSocket::disconnectFromHost()
{
    Q_D(QSslSocket);
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::disconnectFromHost()";
#endif
    if (!d->plainSocket)
        return;
    if (d->state == UnconnectedState)
        return;
    if (d->mode == UnencryptedMode && !d->autoStartHandshake) {
        d->plainSocket->disconnectFromHost();
        return;
    }
    if (d->state <= ConnectingState) {
        d->pendingClose = true;
        return;
    }
    // Make sure we don't process any signal from the CA fetcher
    // (Windows):
    if (auto *backend = d->backend.get())
        backend->cancelCAFetch();

    // Perhaps emit closing()
    if (d->state != ClosingState) {
        d->state = ClosingState;
        emit stateChanged(d->state);
    }

    if (!d->writeBuffer.isEmpty()) {
        d->pendingClose = true;
        return;
    }

    if (d->mode == UnencryptedMode) {
        d->plainSocket->disconnectFromHost();
    } else {
        d->disconnectFromHost();
    }
}